

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O0

void __thiscall Entity::explode(Entity *this)

{
  float fVar1;
  list<Entity_*,_std::allocator<Entity_*>_> *this_00;
  value_type *in_RDI;
  Explosion *e;
  bool big;
  int resourceID;
  Explosion *in_stack_ffffffffffffffd0;
  
  fVar1 = *(float *)(in_RDI + 2);
  this_00 = (list<Entity_*,_std::allocator<Entity_*>_> *)operator_new(0x40);
  Explosion::Explosion
            (in_stack_ffffffffffffffd0,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),
             SUB81((ulong)this_00 >> 0x38,0));
  std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::push_back(this_00,in_RDI);
  resourceID = (int)((ulong)this_00 >> 0x20);
  if (fVar1 < 32.0) {
    my_play_sample(resourceID);
  }
  else {
    my_play_sample(resourceID);
  }
  return;
}

Assistant:

void Entity::explode(void)
{
   bool big;
   if (radius >= 32)
      big = true;
   else
      big = false;
   Explosion *e = new Explosion(x, y, big);
   new_entities.push_back(e);
   if (big)
      my_play_sample(RES_BIGEXPLOSION);
   else
      my_play_sample(RES_SMALLEXPLOSION);
}